

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O0

int consume_markers(j_decompress_ptr cinfo)

{
  jpeg_input_controller *pjVar1;
  j_decompress_ptr in_RDI;
  int val;
  my_inputctl_ptr inputctl;
  int local_4;
  
  pjVar1 = in_RDI->inputctl;
  if (pjVar1->eoi_reached == 0) {
    local_4 = (*in_RDI->marker->read_markers)(in_RDI);
    if (local_4 != 0) {
      if (local_4 == 1) {
        if (*(int *)&pjVar1[1].consume_input == 0) {
          if (pjVar1->has_multiple_scans == 0) {
            in_RDI->err->msg_code = 0x23;
            (*in_RDI->err->error_exit)((j_common_ptr)in_RDI);
          }
          start_input_pass((j_decompress_ptr)0x1100cc);
        }
        else {
          initial_setup(in_RDI);
          *(undefined4 *)&pjVar1[1].consume_input = 0;
        }
      }
      else if (local_4 == 2) {
        pjVar1->eoi_reached = 1;
        if (*(int *)&pjVar1[1].consume_input == 0) {
          if (in_RDI->input_scan_number < in_RDI->output_scan_number) {
            in_RDI->output_scan_number = in_RDI->input_scan_number;
          }
        }
        else if (in_RDI->marker->saw_SOF != 0) {
          in_RDI->err->msg_code = 0x3b;
          (*in_RDI->err->error_exit)((j_common_ptr)in_RDI);
        }
      }
    }
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

METHODDEF(int)
consume_markers(j_decompress_ptr cinfo)
{
  my_inputctl_ptr inputctl = (my_inputctl_ptr)cinfo->inputctl;
  int val;

  if (inputctl->pub.eoi_reached) /* After hitting EOI, read no further */
    return JPEG_REACHED_EOI;

  val = (*cinfo->marker->read_markers) (cinfo);

  switch (val) {
  case JPEG_REACHED_SOS:        /* Found SOS */
    if (inputctl->inheaders) {  /* 1st SOS */
      initial_setup(cinfo);
      inputctl->inheaders = FALSE;
      /* Note: start_input_pass must be called by jdmaster.c
       * before any more input can be consumed.  jdapimin.c is
       * responsible for enforcing this sequencing.
       */
    } else {                    /* 2nd or later SOS marker */
      if (!inputctl->pub.has_multiple_scans)
        ERREXIT(cinfo, JERR_EOI_EXPECTED); /* Oops, I wasn't expecting this! */
      start_input_pass(cinfo);
    }
    break;
  case JPEG_REACHED_EOI:        /* Found EOI */
    inputctl->pub.eoi_reached = TRUE;
    if (inputctl->inheaders) {  /* Tables-only datastream, apparently */
      if (cinfo->marker->saw_SOF)
        ERREXIT(cinfo, JERR_SOF_NO_SOS);
    } else {
      /* Prevent infinite loop in coef ctlr's decompress_data routine
       * if user set output_scan_number larger than number of scans.
       */
      if (cinfo->output_scan_number > cinfo->input_scan_number)
        cinfo->output_scan_number = cinfo->input_scan_number;
    }
    break;
  case JPEG_SUSPENDED:
    break;
  }

  return val;
}